

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O3

void __thiscall deqp::egl::MakeCurrentPerfCase::chooseConfig(MakeCurrentPerfCase *this)

{
  SurfaceType SVar1;
  deUint32 err;
  Library *pLVar2;
  NotSupportedError *this_00;
  EGLint configCount;
  EGLint attribList [5];
  int local_6c;
  string local_68;
  undefined4 local_48;
  int local_44;
  undefined8 local_40;
  undefined4 local_38;
  
  SVar1 = (this->m_spec).surfaceTypes;
  local_44 = (SVar1 & SURFACETYPE_PBUFFER | SVar1 >> 1 & SURFACETYPE_WINDOW) +
             (SVar1 & SURFACETYPE_WINDOW) * 2;
  local_48 = 0x3033;
  local_40 = 0x400003040;
  local_38 = 0x3038;
  pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_6c = 0;
  (*pLVar2->_vptr_Library[2])(pLVar2,this->m_display,&local_48,&this->m_config,1,&local_6c);
  err = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
  eglu::checkError(err,"chooseConfig(m_display, attribList, &m_config, 1, &configCount)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                   ,0xcf);
  if (0 < local_6c) {
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"No compatible configs found","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_68);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MakeCurrentPerfCase::chooseConfig (void)
{
	const EGLint	surfaceBits	= ((m_spec.surfaceTypes & SURFACETYPE_WINDOW) != 0 ? EGL_WINDOW_BIT : 0)
									| ((m_spec.surfaceTypes & SURFACETYPE_PIXMAP) != 0 ? EGL_PIXMAP_BIT : 0)
									| ((m_spec.surfaceTypes & SURFACETYPE_PBUFFER) != 0 ? EGL_PBUFFER_BIT : 0);

	const EGLint	attribList[] = {
		EGL_SURFACE_TYPE,		surfaceBits,
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_NONE
	};

	const Library&	egl			= m_eglTestCtx.getLibrary();
	EGLint			configCount = 0;

	EGLU_CHECK_CALL(egl, chooseConfig(m_display, attribList, &m_config, 1, &configCount));

	if (configCount <= 0)
		throw tcu::NotSupportedError("No compatible configs found");
}